

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionOperator.cpp
# Opt level: O0

void __thiscall
adios2::plugin::EncryptionOperator::EncryptionOperator(EncryptionOperator *this,Params *parameters)

{
  bool bVar1;
  int iVar2;
  runtime_error *this_00;
  pointer ppVar3;
  pointer this_01;
  map *in_RSI;
  PluginOperatorInterface *in_RDI;
  iterator skFileIt;
  EncryptImpl *in_stack_000001a0;
  pointer in_stack_ffffffffffffff58;
  unique_ptr<adios2::plugin::EncryptionOperator::EncryptImpl,_std::default_delete<adios2::plugin::EncryptionOperator::EncryptImpl>_>
  *in_stack_ffffffffffffff60;
  string *psVar4;
  EncryptImpl *in_stack_ffffffffffffff70;
  _Self local_58;
  allocator local_49;
  string local_48 [32];
  _Self local_28 [5];
  
  adios2::plugin::PluginOperatorInterface::PluginOperatorInterface(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR__EncryptionOperator_0010aca8;
  operator_new(0x48);
  EncryptImpl::EncryptImpl(in_stack_ffffffffffffff70);
  std::
  unique_ptr<adios2::plugin::EncryptionOperator::EncryptImpl,std::default_delete<adios2::plugin::EncryptionOperator::EncryptImpl>>
  ::unique_ptr<std::default_delete<adios2::plugin::EncryptionOperator::EncryptImpl>,void>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  iVar2 = sodium_init();
  if (-1 < iVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"secretkeyfile",&local_49);
    local_28[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_ffffffffffffff58,(key_type *)0x106ada);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffff58);
    bVar1 = std::operator!=(local_28,&local_58);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)0x106b3d);
      psVar4 = (string *)&ppVar3->second;
      this_01 = std::
                unique_ptr<adios2::plugin::EncryptionOperator::EncryptImpl,_std::default_delete<adios2::plugin::EncryptionOperator::EncryptImpl>_>
                ::operator->((unique_ptr<adios2::plugin::EncryptionOperator::EncryptImpl,_std::default_delete<adios2::plugin::EncryptionOperator::EncryptImpl>_>
                              *)0x106b57);
      std::__cxx11::string::operator=((string *)this_01,psVar4);
      std::
      unique_ptr<adios2::plugin::EncryptionOperator::EncryptImpl,_std::default_delete<adios2::plugin::EncryptionOperator::EncryptImpl>_>
      ::operator->((unique_ptr<adios2::plugin::EncryptionOperator::EncryptImpl,_std::default_delete<adios2::plugin::EncryptionOperator::EncryptImpl>_>
                    *)0x106b77);
      EncryptImpl::GenerateOrReadKey(in_stack_000001a0);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"libsodium could not be initialized");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

EncryptionOperator::EncryptionOperator(const Params &parameters)
: PluginOperatorInterface(parameters), Impl(new EncryptImpl)
{
    if (sodium_init() < 0)
    {
        throw std::runtime_error("libsodium could not be initialized");
    }

    // in the case "secretkeyfile" is found, so we know the operator should
    // calling Operate(). If "secretkeyfile" is not found, then the operator
    // should be calling InverseOperate(), due to ADIOS calling InverseOperate()
    // not allowing Parameters to be passed.
    auto skFileIt = m_Parameters.find("secretkeyfile");
    if (skFileIt != m_Parameters.end())
    {
        Impl->KeyFilename = skFileIt->second;
        Impl->GenerateOrReadKey();
    }
}